

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

_Bool duckdb_je_ckh_new(tsd_t *tsd,ckh_t *ckh,size_t minitems,ckh_hash_t *ckh_hash,
                       ckh_keycomp_t *keycomp)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  undefined8 *puVar3;
  void *pvVar4;
  arena_t *paVar5;
  rtree_leaf_elm_t *prVar6;
  long lVar7;
  ulong uVar8;
  ckhc_t *key;
  rtree_leaf_elm_t *prVar9;
  atomic_p_t arena;
  byte bVar10;
  ulong uVar11;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  rtree_leaf_elm_t *prVar14;
  uint uVar15;
  rtree_ctx_t *prVar16;
  size_t usize;
  bool bVar17;
  _Bool _Var18;
  rtree_ctx_t rtree_ctx_fallback;
  
  ckh->prng_state = 0x2a;
  ckh->count = 0;
  uVar15 = 0xffffffff;
  do {
    bVar10 = (char)uVar15 + 3;
    uVar15 = uVar15 + 1;
  } while ((ulong)(1L << (bVar10 & 0x3f)) < (minitems + (minitems % 3 ^ 3)) / 3 << 2);
  ckh->lg_minbuckets = uVar15;
  ckh->lg_curbuckets = uVar15;
  uVar8 = 0x10L << (bVar10 & 0x3f);
  ckh->hash = ckh_hash;
  ckh->keycomp = keycomp;
  if (uVar8 < 0x3801) {
    uVar15 = (int)uVar8 + 0x3fU & 0x7fc0;
    if (uVar15 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar15 >> 3]];
    }
    else {
      uVar11 = (ulong)uVar15 * 2 - 1;
      lVar7 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar11 = -1L << (0x3c - ((byte)lVar7 ^ 0x3f) & 0x3f);
      usize = ~uVar11 + (ulong)uVar15 & uVar11;
    }
    if (usize < 0x4000) goto LAB_00d0b66b;
  }
  uVar11 = 0x4000;
  if (0x4000 < uVar8) {
    if (uVar8 < 0x7000000000000001) {
      uVar11 = (0x20L << (bVar10 & 0x3f)) - 1;
      lVar7 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar11 = -1L << (0x3c - ((byte)lVar7 ^ 0x3f) & 0x3f);
      uVar11 = ~uVar11 + uVar8 & uVar11;
    }
    else {
      uVar11 = 0;
    }
    if (uVar11 < uVar8) {
      usize = 0;
      goto LAB_00d0b66b;
    }
  }
  usize = 0;
  if (!CARRY8(duckdb_je_sz_large_pad,uVar11)) {
    usize = uVar11;
  }
LAB_00d0b66b:
  if (usize + 0x8fffffffffffffff < 0x9000000000000000) {
    _Var18 = true;
  }
  else {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
         (arena.repr = duckdb_je_arena_choose_hard(tsd,true),
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
        paVar5 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
        if (paVar5 == (arena_t *)0x0) {
          duckdb_je_tcache_arena_associate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
        else if (paVar5 != (arena_t *)arena.repr) {
          duckdb_je_tcache_arena_reassociate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
      }
    }
    else {
      arena = duckdb_je_arenas[0];
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
      }
    }
    key = (ckhc_t *)
          duckdb_je_arena_palloc
                    ((tsdn_t *)tsd,(arena_t *)arena.repr,usize,0x40,true,usize < 0x3801,
                     (tcache_t *)0x0);
    _Var18 = key == (ckhc_t *)0x0;
    if (!_Var18) {
      if (tsd == (tsd_t *)0x0) {
        prVar16 = &rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init(prVar16);
      }
      else {
        prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar15 = (uint)((ulong)key >> 0x1e) & 0xf;
      prVar14 = (rtree_leaf_elm_t *)((ulong)key & 0xffffffffc0000000);
      uVar8 = (ulong)(uVar15 << 4);
      puVar3 = (undefined8 *)((long)&prVar16->cache[0].leafkey + uVar8);
      prVar9 = *(rtree_leaf_elm_t **)((long)&prVar16->cache[0].leafkey + uVar8);
      if (prVar9 == prVar14) {
        prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + puVar3[1]);
      }
      else if ((rtree_leaf_elm_t *)prVar16->l2_cache[0].leafkey == prVar14) {
        prVar6 = prVar16->l2_cache[0].leaf;
        prVar16->l2_cache[0].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar14;
        puVar3[1] = prVar6;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
      }
      else {
        prVar12 = prVar16->l2_cache + 1;
        prVar13 = prVar12;
        uVar8 = 1;
        if ((rtree_leaf_elm_t *)prVar16->l2_cache[1].leafkey == prVar14) {
          uVar11 = 0;
          bVar17 = false;
        }
        else {
          do {
            uVar11 = uVar8;
            bVar17 = 6 < uVar11;
            if (uVar11 == 7) goto LAB_00d0b98b;
            prVar12 = prVar13 + 1;
            prVar2 = prVar13 + 1;
            prVar13 = prVar12;
            uVar8 = uVar11 + 1;
          } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar14);
          bVar17 = 6 < uVar11;
        }
        prVar6 = prVar12->leaf;
        prVar12->leafkey = prVar16->l2_cache[uVar11].leafkey;
        prVar12->leaf = prVar16->l2_cache[uVar11].leaf;
        prVar16->l2_cache[uVar11].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar14;
        puVar3[1] = prVar6;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
LAB_00d0b98b:
        if (bVar17) {
          prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                             ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,
                              (uintptr_t)key,true,false);
        }
      }
      pvVar4 = duckdb_je_arenas
               [*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                0xfff].repr;
      if (tsd == (tsd_t *)0x0) {
        prVar16 = &rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init(prVar16);
      }
      else {
        prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar8 = (ulong)(uVar15 << 4);
      puVar3 = (undefined8 *)((long)&prVar16->cache[0].leafkey + uVar8);
      prVar9 = *(rtree_leaf_elm_t **)((long)&prVar16->cache[0].leafkey + uVar8);
      if (prVar9 == prVar14) {
        prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + puVar3[1]);
      }
      else if ((rtree_leaf_elm_t *)prVar16->l2_cache[0].leafkey == prVar14) {
        prVar6 = prVar16->l2_cache[0].leaf;
        prVar16->l2_cache[0].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar14;
        puVar3[1] = prVar6;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
      }
      else {
        prVar12 = prVar16->l2_cache + 1;
        if ((rtree_leaf_elm_t *)prVar16->l2_cache[1].leafkey == prVar14) {
          uVar11 = 0;
          bVar17 = false;
        }
        else {
          uVar8 = 1;
          prVar13 = prVar12;
          do {
            uVar11 = uVar8;
            bVar17 = 6 < uVar11;
            if (uVar11 == 7) goto LAB_00d0ba1d;
            prVar12 = prVar13 + 1;
            prVar2 = prVar13 + 1;
            uVar8 = uVar11 + 1;
            prVar13 = prVar12;
          } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar14);
          bVar17 = 6 < uVar11;
        }
        prVar6 = prVar12->leaf;
        prVar12->leafkey = prVar16->l2_cache[uVar11].leafkey;
        prVar12->leaf = prVar16->l2_cache[uVar11].leaf;
        prVar16->l2_cache[uVar11].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar14;
        puVar3[1] = prVar6;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
LAB_00d0ba1d:
        if (bVar17) {
          prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                             ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,
                              (uintptr_t)key,true,false);
        }
      }
      LOCK();
      plVar1 = (long *)((long)pvVar4 + 0x48);
      *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
      UNLOCK();
    }
    ckh->tab = key;
  }
  return _Var18;
}

Assistant:

bool
ckh_new(tsd_t *tsd, ckh_t *ckh, size_t minitems, ckh_hash_t *ckh_hash,
    ckh_keycomp_t *keycomp) {
	bool ret;
	size_t mincells, usize;
	unsigned lg_mincells;

	assert(minitems > 0);
	assert(ckh_hash != NULL);
	assert(keycomp != NULL);

#ifdef CKH_COUNT
	ckh->ngrows = 0;
	ckh->nshrinks = 0;
	ckh->nshrinkfails = 0;
	ckh->ninserts = 0;
	ckh->nrelocs = 0;
#endif
	ckh->prng_state = 42; /* Value doesn't really matter. */
	ckh->count = 0;

	/*
	 * Find the minimum power of 2 that is large enough to fit minitems
	 * entries.  We are using (2+,2) cuckoo hashing, which has an expected
	 * maximum load factor of at least ~0.86, so 0.75 is a conservative load
	 * factor that will typically allow mincells items to fit without ever
	 * growing the table.
	 */
	assert(LG_CKH_BUCKET_CELLS > 0);
	mincells = ((minitems + (3 - (minitems % 3))) / 3) << 2;
	for (lg_mincells = LG_CKH_BUCKET_CELLS;
	    (ZU(1) << lg_mincells) < mincells;
	    lg_mincells++) {
		/* Do nothing. */
	}
	ckh->lg_minbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->lg_curbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->hash = ckh_hash;
	ckh->keycomp = keycomp;

	usize = sz_sa2u(sizeof(ckhc_t) << lg_mincells, CACHELINE);
	if (unlikely(usize == 0 || usize > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto label_return;
	}
	ckh->tab = (ckhc_t *)ipallocztm(tsd_tsdn(tsd), usize, CACHELINE, true,
	    NULL, true, arena_ichoose(tsd, NULL));
	if (ckh->tab == NULL) {
		ret = true;
		goto label_return;
	}

	ret = false;
label_return:
	return ret;
}